

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  ostream *this;
  string local_b0;
  undefined1 local_90 [8];
  CTape tape;
  undefined1 local_30 [8];
  string magicPhrase;
  
  magicPhrase.field_2._12_4_ = 0;
  std::__cxx11::string::string((string *)local_30);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)local_30);
  CTape::CTape((CTape *)local_90,0x1e);
  CTape::produce(&local_b0,(CTape *)local_90,(string *)local_30);
  this = std::operator<<((ostream *)&std::cout,(string *)&local_b0);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_b0);
  magicPhrase.field_2._12_4_ = 0;
  CTape::~CTape((CTape *)local_90);
  std::__cxx11::string::~string((string *)local_30);
  return magicPhrase.field_2._12_4_;
}

Assistant:

int main()
{
    string magicPhrase;
    getline(cin, magicPhrase);

    CTape tape;

    cout << tape.produce(magicPhrase) << endl;

    return 0;
}